

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O2

int __thiscall OctetType::serialise(OctetType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = BER_CONTAINER::serialise
                    (&this->super_BER_CONTAINER,buf,max_len,(this->_value)._M_string_length);
  if (-1 < (int)uVar1) {
    memcpy(buf + uVar1,(this->_value)._M_dataplus._M_p,(this->_value)._M_string_length);
    uVar1 = ((int)(buf + uVar1) + (int)(this->_value)._M_string_length) - (int)buf;
  }
  return uVar1;
}

Assistant:

int OctetType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, _value.length());
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    memcpy(ptr, _value.data(), _value.length());
    ptr += _value.length();

    return ptr - buf;
}